

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,int len,char *s)

{
  size_t sVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint uVar3;
  CBStringException bstr__cppwrapper_exception;
  string local_88;
  string local_68;
  CBStringException local_48;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00184840;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (0x7ffffffe < sVar1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"CBString::Failure in (char *) constructor, string too large",
                 "");
      CBStringException::CBStringException(&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&local_48);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)sVar1;
    uVar3 = (int)sVar1 + 1;
    if (len < (int)uVar3) {
      len = uVar3;
    }
    (this->super_tagbstring).mlen = len;
    __dest = (uchar *)malloc((ulong)(uint)len);
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,s,(ulong)uVar3);
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CBString::Failure in (int len, char *) constructor","");
  CBStringException::CBStringException(&local_48,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&local_48);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (int len, const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (mlen < len) mlen = len;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, slen + 1);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (int len, char *) constructor");
}